

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O2

int avro::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char cVar1;
  int extraout_EAX;
  size_t n;
  uint8_t *p;
  StreamWriter w;
  size_t local_48;
  uint8_t *local_40;
  StreamWriter local_38;
  
  local_40 = (uint8_t *)0x0;
  local_48 = 0;
  StreamWriter::StreamWriter(&local_38,(OutputStream *)src);
  while( true ) {
    cVar1 = (**(code **)(*(long *)dst + 0x10))(dst,&local_40,&local_48);
    if (cVar1 == '\0') break;
    StreamWriter::writeBytes(&local_38,local_40,local_48);
  }
  StreamWriter::flush(&local_38);
  return extraout_EAX;
}

Assistant:

inline void copy(InputStream& in, OutputStream& out)
{
    const uint8_t *p = 0;
    size_t n = 0;
    StreamWriter w(out);
    while (in.next(&p, &n)) {
        w.writeBytes(p, n);
    }
    w.flush();
}